

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O1

void __thiscall train_context::build_v_diff(train_context *this,bool transpose)

{
  long *plVar1;
  pointer *pppgVar2;
  pointer pvVar3;
  pointer __src;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_t sVar9;
  void *__dest;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined7 in_register_00000031;
  iterator __position;
  ulong uVar13;
  uint __len;
  float *arr;
  ggml_tensor *diff;
  string __str;
  ggml_tensor *local_b0;
  undefined4 local_a4;
  ggml_tensor *local_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vector<ggml_tensor*,std::allocator<ggml_tensor*>> *local_38;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000031,transpose);
  puts("build_v_diff");
  if (1 < this->n_layers) {
    local_38 = (vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&this->v_diff;
    uVar13 = 0;
    do {
      pvVar3 = (this->v_diff_tmp).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (ulong)((long)*(pointer *)
                             ((long)&pvVar3[uVar13].
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar3[uVar13].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data) >> 2;
      iVar11 = this->n_embd;
      uVar7 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
      if ((int)((long)uVar7 % (long)iVar11) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
                   ,0xeb,"GGML_ASSERT(%s) failed","n_elem % n_embd == 0");
      }
      iVar12 = (int)((long)uVar7 / (long)iVar11);
      iVar10 = iVar11;
      iVar6 = iVar12;
      if ((char)local_a4 == '\0') {
        iVar10 = iVar12;
        iVar6 = iVar11;
      }
      local_b0 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx_ggml,0,(long)iVar6,(long)iVar10);
      local_78 = local_68;
      local_a0 = local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"diff_","");
      __len = 1;
      if (9 < uVar13) {
        uVar4 = 4;
        uVar7 = uVar13;
        do {
          __len = uVar4;
          uVar5 = (uint)uVar7;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_00129610;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_00129610;
          }
          if (uVar5 < 10000) goto LAB_00129610;
          uVar7 = (uVar7 & 0xffffffff) / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_00129610:
      local_98 = local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,__len,(uint)uVar13);
      uVar7 = 0xf;
      if (local_78 != local_68) {
        uVar7 = local_68[0];
      }
      if (uVar7 < (ulong)(local_90 + local_70)) {
        uVar7 = 0xf;
        if (local_98 != local_88) {
          uVar7 = local_88[0];
        }
        if (uVar7 < (ulong)(local_90 + local_70)) goto LAB_00129688;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      }
      else {
LAB_00129688:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      }
      plVar1 = puVar8 + 2;
      if ((long *)*puVar8 == plVar1) {
        local_48 = *plVar1;
        uStack_40 = *(undefined4 *)(puVar8 + 3);
        uStack_3c = *(undefined4 *)((long)puVar8 + 0x1c);
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar1;
        local_58 = (long *)*puVar8;
      }
      local_50 = puVar8[1];
      *puVar8 = plVar1;
      puVar8[1] = 0;
      *(undefined1 *)plVar1 = 0;
      ggml_set_name(local_a0,local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      pvVar3 = pvVar3 + uVar13;
      sVar9 = ggml_nbytes(local_b0);
      __dest = malloc(sVar9);
      local_b0->data = __dest;
      __src = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
      local_a0 = (ggml_tensor *)pvVar3;
      if ((char)local_a4 == '\0') {
        sVar9 = ggml_nbytes();
        memcpy(__dest,__src,sVar9);
      }
      else if (0 < iVar12) {
        iVar11 = 0;
        do {
          iVar6 = this->n_embd;
          if (0 < iVar6) {
            uVar7 = 0;
            do {
              ggml_set_f32_nd(*(undefined4 *)(__src + ((long)(iVar6 * iVar11) + uVar7) * 4),local_b0
                              ,iVar11,uVar7 & 0xffffffff,0,0);
              iVar6 = this->n_embd;
              uVar7 = uVar7 + 1;
            } while ((int)uVar7 < iVar6);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar12);
      }
      __position._M_current =
           (this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>(local_38,__position,&local_b0);
      }
      else {
        *__position._M_current = local_b0;
        pppgVar2 = &(this->v_diff).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppgVar2 = *pppgVar2 + 1;
      }
      print_debug_tensor(local_b0,SUB81(__position._M_current,0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,0);
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->n_layers + -1);
  }
  return;
}

Assistant:

void build_v_diff(bool transpose) {
        printf("build_v_diff\n");
        for (int il = 0; il < n_layers - 1; il++) {
            auto & diff_tmp = v_diff_tmp[il];
            int n_elem = diff_tmp.size() / sizeof(float);
            GGML_ASSERT(n_elem % n_embd == 0);
            int n_rows = n_elem / n_embd;
            struct ggml_tensor * diff = transpose
                ? ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_rows, n_embd)
                : ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_embd, n_rows);
            ggml_set_name(diff, (std::string("diff_") + std::to_string(il)).c_str());
            diff->data = malloc(ggml_nbytes(diff)); // TODO: get rid of this malloc if possible
            if (transpose) {
                // copy data & transpose
                float * arr = (float *) diff_tmp.data();
                for (int ir = 0; ir < n_rows; ++ir) {
                    for (int ic = 0; ic < n_embd; ++ic) {
                        float f = arr[ir*n_embd + ic];
                        ggml_set_f32_nd(diff, ir, ic, 0, 0, f);
                    }
                }
            } else {
                // only copy
                memcpy(diff->data, diff_tmp.data(), ggml_nbytes(diff));
            }
            v_diff.push_back(diff);
            print_debug_tensor(diff);
            // free memory of diff_tmp
            diff_tmp.resize(0);
        }
    }